

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::usdc::USDCReader::Impl::ReadUSDC(Impl *this)

{
  bool bVar1;
  CrateReader *pCVar2;
  string sStack_d8;
  CrateReaderConfig local_b8;
  
  pCVar2 = this->crate_reader;
  if (pCVar2 != (CrateReader *)0x0) {
    crate::CrateReader::~CrateReader(pCVar2);
    operator_delete(pCVar2,0x270);
  }
  local_b8.maxTOCSections = 0x20;
  local_b8.maxNumTokens = 0x4000000;
  local_b8.maxNumStrings = 0x4000000;
  local_b8.maxNumFields = 0x10000000;
  local_b8.maxNumFieldSets = 0x10000000;
  local_b8.maxNumSpecifiers = 0x10000000;
  local_b8.maxNumPaths = 0x10000000;
  local_b8.maxNumIndices = 0x10000000;
  local_b8.maxDictElements = 0x100;
  local_b8.maxArrayElements = 0x40000000;
  local_b8.maxAssetPathElements = 0x200;
  local_b8.maxTokenLength = 0x1000;
  local_b8.maxStringLength = 0x4000000;
  local_b8.maxVariantsMapElements = 0x80;
  local_b8.maxValueRecursion = 0x10;
  local_b8.maxPathIndicesDecodeIteration = 0x10000000;
  local_b8.maxInts = 0x40000000;
  local_b8.numThreads = (this->_config).numThreads;
  local_b8.maxMemoryBudget = (this->_config).kMaxAllowedMemoryInMB << 0x14;
  pCVar2 = (CrateReader *)operator_new(0x270);
  crate::CrateReader::CrateReader(pCVar2,this->_sr,&local_b8);
  this->crate_reader = pCVar2;
  (this->_warn)._M_string_length = 0;
  *(this->_warn)._M_dataplus._M_p = '\0';
  (this->_err)._M_string_length = 0;
  *(this->_err)._M_dataplus._M_p = '\0';
  bVar1 = crate::CrateReader::ReadBootStrap(this->crate_reader);
  if ((((((bVar1) && (bVar1 = crate::CrateReader::ReadTOC(this->crate_reader), bVar1)) &&
        (bVar1 = crate::CrateReader::ReadTokens(this->crate_reader), bVar1)) &&
       ((bVar1 = crate::CrateReader::ReadStrings(this->crate_reader), bVar1 &&
        (bVar1 = crate::CrateReader::ReadFields(this->crate_reader), bVar1)))) &&
      ((bVar1 = crate::CrateReader::ReadFieldSets(this->crate_reader), bVar1 &&
       ((bVar1 = crate::CrateReader::ReadPaths(this->crate_reader), bVar1 &&
        (bVar1 = crate::CrateReader::ReadSpecs(this->crate_reader), bVar1)))))) &&
     (bVar1 = crate::CrateReader::BuildLiveFieldSets(this->crate_reader), bVar1)) {
    crate::CrateReader::GetWarning_abi_cxx11_(&sStack_d8,this->crate_reader);
    ::std::__cxx11::string::append((string *)&this->_warn);
    ::std::__cxx11::string::_M_dispose();
    crate::CrateReader::GetError_abi_cxx11_(&sStack_d8,this->crate_reader);
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    return true;
  }
  crate::CrateReader::GetWarning_abi_cxx11_(&sStack_d8,this->crate_reader);
  ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&sStack_d8);
  ::std::__cxx11::string::_M_dispose();
  crate::CrateReader::GetError_abi_cxx11_(&sStack_d8,this->crate_reader);
  ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&sStack_d8);
  ::std::__cxx11::string::_M_dispose();
  return false;
}

Assistant:

bool USDCReader::Impl::ReadUSDC() {
  if (crate_reader) {
    delete crate_reader;
  }

  // TODO: Setup CrateReaderConfig.
  crate::CrateReaderConfig config;

  // Transfer settings
  config.numThreads = _config.numThreads;

  size_t sz_mb = _config.kMaxAllowedMemoryInMB;
  if (sizeof(size_t) == 4) {
    // 32bit
    // cap to 2GB
    sz_mb = (std::min)(size_t(1024 * 2), sz_mb);

    config.maxMemoryBudget = sz_mb * 1024 * 1024;
  } else {
    config.maxMemoryBudget = _config.kMaxAllowedMemoryInMB * 1024ull * 1024ull;
  }

  crate_reader = new crate::CrateReader(_sr, config);

  _warn.clear();
  _err.clear();

  if (!crate_reader->ReadBootStrap()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadTOC()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  // Read known sections

  if (!crate_reader->ReadTokens()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadStrings()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadFields()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadFieldSets()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadPaths()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadSpecs()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  // TODO(syoyo): Read unknown sections

  ///
  /// Reconstruct C++ representation of USD scene graph.
  ///
  DCOUT("BuildLiveFieldSets");
  if (!crate_reader->BuildLiveFieldSets()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();

    return false;
  }

  _warn += crate_reader->GetWarning();
  _err += crate_reader->GetError();

  DCOUT("Read Crate.");

  return true;
}